

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_decl.h
# Opt level: O0

bool __thiscall google::protobuf::internal::MapTypeCard::is_utf8(MapTypeCard *this)

{
  bool bVar1;
  WireType WVar2;
  CppType CVar3;
  LogMessage *pLVar4;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  LogMessageFatal local_60 [19];
  Voidify local_4d [20];
  byte local_39;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  LogMessageFatal local_28 [23];
  Voidify local_11;
  MapTypeCard *local_10;
  MapTypeCard *this_local;
  
  local_10 = this;
  WVar2 = wiretype(this);
  local_39 = 0;
  if (WVar2 != WIRETYPE_LENGTH_DELIMITED) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"wiretype() == WireFormatLite::WIRETYPE_LENGTH_DELIMITED");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_decl.h"
               ,0xb5,local_38._M_len,local_38._M_str);
    local_39 = 1;
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_11,pLVar4);
  }
  if ((local_39 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
  }
  CVar3 = cpp_type(this);
  if (CVar3 != kString) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_70,"cpp_type() == CppType::kString");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_decl.h"
               ,0xb6,local_70._M_len,local_70._M_str);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_60);
    absl::lts_20240722::log_internal::Voidify::operator&&(local_4d,pLVar4);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_60);
  }
  bVar1 = is_zigzag_utf8(this);
  return bVar1;
}

Assistant:

bool is_utf8() const {
    ABSL_DCHECK(wiretype() == WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
    ABSL_DCHECK(cpp_type() == CppType::kString);
    return is_zigzag_utf8();
  }